

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token_enc.c
# Opt level: O0

void VP8TBufferClear(VP8TBuffer *b)

{
  VP8TBuffer *in_RDI;
  VP8Tokens *next;
  VP8Tokens *p;
  VP8Tokens *local_10;
  
  if (in_RDI != (VP8TBuffer *)0x0) {
    local_10 = in_RDI->pages;
    while (local_10 != (VP8Tokens *)0x0) {
      local_10 = local_10->next;
      WebPSafeFree((void *)0x18101c);
    }
    VP8TBufferInit(in_RDI,in_RDI->page_size);
  }
  return;
}

Assistant:

void VP8TBufferClear(VP8TBuffer* const b) {
  if (b != NULL) {
    VP8Tokens* p = b->pages;
    while (p != NULL) {
      VP8Tokens* const next = p->next;
      WebPSafeFree(p);
      p = next;
    }
    VP8TBufferInit(b, b->page_size);
  }
}